

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_current_seconds(asmcode *code,compiler_options *param_2)

{
  operand local_74;
  operation local_70 [2];
  operand local_68 [2];
  operation local_60;
  operand local_5c [2];
  operation local_54;
  operand local_50;
  operation local_4c;
  code *local_48;
  operand local_3c [2];
  operation local_34;
  operand local_30 [2];
  operation local_28;
  operand local_24 [2];
  operation local_1c;
  compiler_options *local_18;
  compiler_options *param_1_local;
  asmcode *code_local;
  
  local_18 = param_2;
  param_1_local = (compiler_options *)code;
  save_before_foreign_call(code);
  align_stack((asmcode *)param_1_local);
  local_1c = MOV;
  local_24[1] = 0x18;
  local_24[0] = R10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_1c,local_24 + 1,local_24);
  local_28 = XOR;
  local_30[1] = 9;
  local_30[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_28,local_30 + 1,local_30);
  local_34 = MOV;
  local_3c[1] = 0x14;
  local_3c[0] = NUMBER;
  local_48 = _skiwi_current_seconds;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            ((asmcode *)param_1_local,&local_34,local_3c + 1,local_3c,(unsigned_long *)&local_48);
  local_4c = CALLEXTERNAL;
  local_50 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_4c,&local_50);
  local_54 = MOV;
  local_5c[1] = 0x13;
  local_5c[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_54,local_5c + 1,local_5c);
  restore_stack((asmcode *)param_1_local);
  restore_after_foreign_call((asmcode *)param_1_local);
  local_60 = SHL;
  local_68[1] = 9;
  local_68[0] = NUMBER;
  local_70[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,&local_60,local_68 + 1,local_68,(int *)(local_70 + 1));
  local_70[0] = JMP;
  local_74 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,local_70,&local_74);
  return;
}

Assistant:

void compile_current_seconds(ASM::asmcode& code, const compiler_options& /*options*/)
  {
  save_before_foreign_call(code);
  align_stack(code);
  code.add(asmcode::MOV, asmcode::R15, CONTEXT); // r15 should be saved by the callee but r10 not, so we save the context in r15
#ifdef _WIN32
  code.add(asmcode::SUB, asmcode::RSP, asmcode::NUMBER, 32);
#else
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RAX);
#endif  
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_current_seconds);
  code.add(asmcode::CALLEXTERNAL, asmcode::R11);
  code.add(asmcode::MOV, CONTEXT, asmcode::R15); // now we restore the context
  restore_stack(code);
  restore_after_foreign_call(code);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::JMP, CONTINUE);
  }